

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-t16.inc.c
# Opt level: O0

void disas_t16_extract_xll_noshr(DisasContext_conflict1 *ctx,arg_s_rrr_shi *a,uint16_t insn)

{
  uint32_t uVar1;
  uint16_t insn_local;
  arg_s_rrr_shi *a_local;
  DisasContext_conflict1 *ctx_local;
  
  uVar1 = extract32((uint)insn,3,3);
  a->rm = uVar1;
  uVar1 = extract32((uint)insn,0,3);
  a->rn = uVar1;
  a->s = 1;
  a->rd = 0;
  a->shim = 0;
  a->shty = 0;
  return;
}

Assistant:

static void disas_t16_extract_xll_noshr(DisasContext *ctx, arg_s_rrr_shi *a, uint16_t insn)
{
    a->rm = extract32(insn, 3, 3);
    a->rn = extract32(insn, 0, 3);
    a->s = 1;
    a->rd = 0;
    a->shim = 0;
    a->shty = 0;
}